

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

void __thiscall
t_swift_generator::generate_old_swift_struct
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  char *pcVar4;
  pointer pptVar5;
  bool bVar6;
  string visibility;
  char *local_90;
  long local_88;
  char local_80 [16];
  string local_70;
  string local_50;
  
  pcVar4 = "public";
  if ((int)CONCAT71(in_register_00000009,is_private) != 0) {
    pcVar4 = "private";
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,pcVar4,
             pcVar4 + (CONCAT71(in_register_00000009,is_private) & 0xffffffff) + 6);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_70._M_dataplus._M_p,local_70._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_90,local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," final class ",0xd);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,*(char **)CONCAT44(extraout_var,iVar2),
             ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct);
  if ((char)iVar2 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(out," : ErrorType",0xc);
  }
  block_open(this,out);
  pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar5 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_70._M_dataplus._M_p,local_70._M_string_length);
      declare_property_abi_cxx11_(&local_50,this,*pptVar5,is_private);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_90,local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," init()",7);
  block_open(this,out);
  block_close(this,out,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      bVar6 = pptVar5 !=
              (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish, bVar6; pptVar5 = pptVar5 + 1) {
    bVar1 = field_is_optional(this,*pptVar5);
    if (!bVar1) break;
  }
  if (bVar6) {
    generate_swift_struct_init(this,out,tstruct,false,is_private);
  }
  for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      bVar6 = pptVar5 !=
              (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish, bVar6; pptVar5 = pptVar5 + 1) {
    bVar1 = field_is_optional(this,*pptVar5);
    if (bVar1) break;
  }
  if (bVar6) {
    generate_swift_struct_init(this,out,tstruct,true,is_private);
  }
  block_close(this,out,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

void t_swift_generator::generate_old_swift_struct(ostream& out,
                                                  t_struct* tstruct,
                                                  bool is_private) {
  string visibility = is_private ? "private" : "public";

  out << indent() << visibility << " final class " << tstruct->get_name();

  if (tstruct->is_xception()) {
    out << " : ErrorType";
  }

  block_open(out);

  // properties
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    out << endl;
    out << indent() << declare_property(*m_iter, is_private) << endl;
  }

  out << endl;

  // init

  indent(out) << visibility << " init()";
  block_open(out);
  block_close(out);

  out << endl;

  if (struct_has_required_fields(tstruct)) {
    generate_swift_struct_init(out, tstruct, false, is_private);
  }
  if (struct_has_optional_fields(tstruct)) {
    generate_swift_struct_init(out, tstruct, true, is_private);
  }

  block_close(out);

  out << endl;
}